

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                  *this)

{
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bb490;
  SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::~SIMDNewPFor
            (&(this->codec1).super_SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}